

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

bool booster::operator>(string_type *l,sub_match<const_char_*> *r)

{
  int iVar1;
  string *in_RDI;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  byte bVar2;
  string local_30 [48];
  
  sub_match::operator_cast_to_string
            ((sub_match<const_char_*> *)
             CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  iVar1 = std::__cxx11::string::compare(in_RDI);
  bVar2 = 0 < iVar1;
  std::__cxx11::string::~string(local_30);
  return (bool)(bVar2 & 1);
}

Assistant:

bool operator>(
		typename sub_match<Iterator>::string_type const &l,
		sub_match<Iterator> const &r) 
	{ return l.compare(r) > 0; }